

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Gridded_Data_PDU::Gridded_Data_PDU(Gridded_Data_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Gridded_Data_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Gridded_Data_PDU_003312b0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EnvProcID);
  DATA_TYPE::EnvironmentType::EnvironmentType(&this->m_EnvType);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ::vector(&this->m_vpGridAxisDesc);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ::vector(&this->m_vGridData);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Gridded_Data_PDU::Gridded_Data_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}